

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# steal.c
# Opt level: O0

void stealgold(monst *mtmp)

{
  short sVar1;
  boolean bVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  bool bVar7;
  long local_40;
  int gold_price;
  long tmp;
  obj *ygold;
  obj *fgold;
  monst *mtmp_local;
  
  ygold = gold_at(level,(int)u.ux,(int)u.uy);
  while( true ) {
    bVar7 = false;
    if (ygold != (obj *)0x0) {
      bVar7 = ygold->otyp != 0x1ef;
    }
    if (!bVar7) break;
    ygold = (ygold->v).v_nexthere;
  }
  tmp = (long)findgold(invent);
  if ((ygold == (obj *)0x0) ||
     ((((obj *)tmp != (obj *)0x0 && (ygold->quan <= ((obj *)tmp)->quan)) &&
      (iVar3 = rn2(5), iVar3 != 0)))) {
    if ((obj *)tmp != (obj *)0x0) {
      sVar1 = objects[0x1ef].oc_cost;
      lVar6 = money_cnt(invent);
      lVar6 = somegold(lVar6);
      local_40 = (lVar6 + (int)sVar1 + -1) / (long)(int)sVar1;
      if (((obj *)tmp)->quan <= local_40) {
        local_40 = (long)((obj *)tmp)->quan;
      }
      if (local_40 < ((obj *)tmp)->quan) {
        tmp = (long)splitobj((obj *)tmp,local_40);
      }
      freeinv((obj *)tmp);
      add_to_minv(mtmp,(obj *)tmp);
      pline("Your purse feels lighter.");
      bVar2 = tele_restrict(mtmp);
      if (bVar2 == '\0') {
        rloc(level,mtmp,'\0');
      }
      monflee(mtmp,0,'\0','\0');
      iflags.botl = '\x01';
    }
  }
  else {
    obj_extract_self(ygold);
    add_to_minv(mtmp,ygold);
    newsym((int)u.ux,(int)u.uy);
    pcVar4 = Monnam(mtmp);
    pcVar5 = body_part(5);
    pcVar5 = makeplural(pcVar5);
    pline("%s quickly snatches some gold from between your %s!",pcVar4,pcVar5);
    if (((obj *)tmp == (obj *)0x0) || (iVar3 = rn2(5), iVar3 == 0)) {
      bVar2 = tele_restrict(mtmp);
      if (bVar2 == '\0') {
        rloc(level,mtmp,'\0');
      }
      monflee(mtmp,0,'\0','\0');
    }
  }
  return;
}

Assistant:

void stealgold(struct monst *mtmp)
{
	struct obj *fgold = gold_at(level, u.ux, u.uy);
	struct obj *ygold;
	long tmp;

        /* skip lesser coins on the floor */        
        while (fgold && fgold->otyp != GOLD_PIECE) fgold = fgold->nexthere; 

        /* Do you have real gold? */
        ygold = findgold(invent);

	if (fgold && ( !ygold || fgold->quan > ygold->quan || !rn2(5))) {
            obj_extract_self(fgold);
	    add_to_minv(mtmp, fgold);
	    newsym(u.ux, u.uy);
	    pline("%s quickly snatches some gold from between your %s!",
		    Monnam(mtmp), makeplural(body_part(FOOT)));
	    if (!ygold || !rn2(5)) {
		if (!tele_restrict(mtmp)) rloc(level, mtmp, FALSE);
		monflee(mtmp, 0, FALSE, FALSE);
	    }
	} else if (ygold) {
            const int gold_price = objects[GOLD_PIECE].oc_cost;
	    tmp = (somegold(money_cnt(invent)) + gold_price - 1) / gold_price;
	    tmp = min(tmp, ygold->quan);
            if (tmp < ygold->quan) ygold = splitobj(ygold, tmp);
            freeinv(ygold);
            add_to_minv(mtmp, ygold);
	    pline("Your purse feels lighter.");
	    if (!tele_restrict(mtmp)) rloc(level, mtmp, FALSE);
	    monflee(mtmp, 0, FALSE, FALSE);
	    iflags.botl = 1;
	}
}